

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O2

void __thiscall
wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::
doWalkFunction(CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
               *this,Function *func)

{
  std::
  vector<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
  ::clear(&this->basicBlocks);
  std::
  _Rb_tree<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::pair<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>_>,_std::less<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>_>_>
  ::clear(&(this->debugIds)._M_t);
  startBasicBlock(this);
  this->entry = this->currBasicBlock;
  Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>::walk
            ((Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_> *)this,
             &func->body);
  this->exit = this->currBasicBlock;
  if ((this->branches)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    __assert_fail("branches.size() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/cfg-traversal.h"
                  ,0x1bf,
                  "void wasm::CFGWalker<wasm::CoalesceLocals, wasm::Visitor<wasm::CoalesceLocals>, wasm::Liveness>::doWalkFunction(Function *) [SubType = wasm::CoalesceLocals, VisitorType = wasm::Visitor<wasm::CoalesceLocals>, Contents = wasm::Liveness]"
                 );
  }
  if ((this->ifStack).
      super__Vector_base<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->ifStack).
      super__Vector_base<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __assert_fail("ifStack.size() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/cfg-traversal.h"
                  ,0x1c0,
                  "void wasm::CFGWalker<wasm::CoalesceLocals, wasm::Visitor<wasm::CoalesceLocals>, wasm::Liveness>::doWalkFunction(Function *) [SubType = wasm::CoalesceLocals, VisitorType = wasm::Visitor<wasm::CoalesceLocals>, Contents = wasm::Liveness]"
                 );
  }
  if ((this->loopStack).
      super__Vector_base<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->loopStack).
      super__Vector_base<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __assert_fail("loopStack.size() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/cfg-traversal.h"
                  ,0x1c1,
                  "void wasm::CFGWalker<wasm::CoalesceLocals, wasm::Visitor<wasm::CoalesceLocals>, wasm::Liveness>::doWalkFunction(Function *) [SubType = wasm::CoalesceLocals, VisitorType = wasm::Visitor<wasm::CoalesceLocals>, Contents = wasm::Liveness]"
                 );
  }
  if ((this->tryStack).
      super__Vector_base<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->tryStack).
      super__Vector_base<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    if ((this->throwingInstsStack).
        super__Vector_base<std::vector<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->throwingInstsStack).
        super__Vector_base<std::vector<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      __assert_fail("throwingInstsStack.size() == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/cfg-traversal.h"
                    ,0x1c3,
                    "void wasm::CFGWalker<wasm::CoalesceLocals, wasm::Visitor<wasm::CoalesceLocals>, wasm::Liveness>::doWalkFunction(Function *) [SubType = wasm::CoalesceLocals, VisitorType = wasm::Visitor<wasm::CoalesceLocals>, Contents = wasm::Liveness]"
                   );
    }
    if ((this->unwindExprStack).
        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (this->unwindExprStack).
        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      if ((this->processCatchStack).
          super__Vector_base<std::vector<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          (this->processCatchStack).
          super__Vector_base<std::vector<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        return;
      }
      __assert_fail("processCatchStack.size() == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/cfg-traversal.h"
                    ,0x1c5,
                    "void wasm::CFGWalker<wasm::CoalesceLocals, wasm::Visitor<wasm::CoalesceLocals>, wasm::Liveness>::doWalkFunction(Function *) [SubType = wasm::CoalesceLocals, VisitorType = wasm::Visitor<wasm::CoalesceLocals>, Contents = wasm::Liveness]"
                   );
    }
    __assert_fail("unwindExprStack.size() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/cfg-traversal.h"
                  ,0x1c4,
                  "void wasm::CFGWalker<wasm::CoalesceLocals, wasm::Visitor<wasm::CoalesceLocals>, wasm::Liveness>::doWalkFunction(Function *) [SubType = wasm::CoalesceLocals, VisitorType = wasm::Visitor<wasm::CoalesceLocals>, Contents = wasm::Liveness]"
                 );
  }
  __assert_fail("tryStack.size() == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/cfg-traversal.h"
                ,0x1c2,
                "void wasm::CFGWalker<wasm::CoalesceLocals, wasm::Visitor<wasm::CoalesceLocals>, wasm::Liveness>::doWalkFunction(Function *) [SubType = wasm::CoalesceLocals, VisitorType = wasm::Visitor<wasm::CoalesceLocals>, Contents = wasm::Liveness]"
               );
}

Assistant:

void doWalkFunction(Function* func) {
    basicBlocks.clear();
    debugIds.clear();

    startBasicBlock();
    entry = currBasicBlock;
    ControlFlowWalker<SubType, VisitorType>::doWalkFunction(func);
    exit = currBasicBlock;

    assert(branches.size() == 0);
    assert(ifStack.size() == 0);
    assert(loopStack.size() == 0);
    assert(tryStack.size() == 0);
    assert(throwingInstsStack.size() == 0);
    assert(unwindExprStack.size() == 0);
    assert(processCatchStack.size() == 0);
  }